

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O2

void __thiscall Snes_Spc::clear_echo(Snes_Spc *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  
  if (((this->dsp).m.regs[0x6c] & 0x20) == 0) {
    lVar2 = (ulong)(this->dsp).m.regs[0x6d] * 0x100;
    iVar1 = (int)lVar2;
    uVar3 = ((this->dsp).m.regs[0x7d] & 0xf) * 0x800 + iVar1;
    if (0xffff < uVar3) {
      uVar3 = 0x10000;
    }
    memset((this->m).ram.ram + lVar2,0xff,(long)(int)(uVar3 - iVar1));
    return;
  }
  return;
}

Assistant:

void Snes_Spc::clear_echo()
{
	if ( !(dsp.read( Spc_Dsp::r_flg ) & 0x20) )
	{
		int addr = 0x100 * dsp.read( Spc_Dsp::r_esa );
		int end  = addr + 0x800 * (dsp.read( Spc_Dsp::r_edl ) & 0x0F);
		if ( end > 0x10000 )
			end = 0x10000;
		memset( &RAM [addr], 0xFF, end - addr );
	}
}